

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O1

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::skip_one_line_comment
          (lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  char_t cVar2;
  input_stream_t<cfgfile::string_trait_t> *this_00;
  
  this_00 = this->m_stream;
  while( true ) {
    bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(this_00);
    if (bVar1) {
      return;
    }
    cVar2 = input_stream_t<cfgfile::string_trait_t>::get(this->m_stream);
    if (cVar2 == const_t<cfgfile::string_trait_t>::c_carriage_return) break;
    if (cVar2 == const_t<cfgfile::string_trait_t>::c_line_feed) {
      return;
    }
    this_00 = this->m_stream;
  }
  return;
}

Assistant:

void skip_one_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			while( ch != const_t< Trait >::c_carriage_return &&
				ch != const_t< Trait >::c_line_feed &&
				!m_stream.at_end() )
					ch = m_stream.get();
		}
	}